

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int langidFromSelect(Fts3Table *p,sqlite3_stmt *pSelect)

{
  int iVar1;
  
  if (p->zLanguageid != (char *)0x0) {
    iVar1 = sqlite3_column_int(pSelect,p->nColumn + 1);
    return iVar1;
  }
  return 0;
}

Assistant:

static int langidFromSelect(Fts3Table *p, sqlite3_stmt *pSelect){
  int iLangid = 0;
  if( p->zLanguageid ) iLangid = sqlite3_column_int(pSelect, p->nColumn+1);
  return iLangid;
}